

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.c
# Opt level: O2

void array_container_add_from_range(array_container_t *arr,uint32_t min,uint32_t max,uint16_t step)

{
  undefined2 in_register_0000000a;
  uint32_t value;
  
  for (; min < max; min = min + CONCAT22(in_register_0000000a,step)) {
    array_container_append(arr,(uint16_t)min);
  }
  return;
}

Assistant:

void array_container_add_from_range(array_container_t *arr, uint32_t min,
                                    uint32_t max, uint16_t step) {
    for (uint32_t value = min; value < max; value += step) {
        array_container_append(arr, value);
    }
}